

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_decode_data_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::
ObjCHelperDeathTest_TextFormatDecodeData_Failures_Test::
~ObjCHelperDeathTest_TextFormatDecodeData_Failures_Test
          (ObjCHelperDeathTest_TextFormatDecodeData_Failures_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ObjCHelperDeathTest, TextFormatDecodeData_Failures) {
  TextFormatDecodeData decode_data;

  // Empty inputs.

  EXPECT_DEATH(decode_data.AddString(1, "", ""),
               "error: got empty string for making TextFormat data, input:");
  EXPECT_DEATH(decode_data.AddString(1, "a", ""),
               "error: got empty string for making TextFormat data, input:");
  EXPECT_DEATH(decode_data.AddString(1, "", "a"),
               "error: got empty string for making TextFormat data, input:");

  // Null char in the string.

  std::string str_with_null_char("ab\0c", 4);
  EXPECT_DEATH(
      decode_data.AddString(1, str_with_null_char, "def"),
      "error: got a null char in a string for making TextFormat data, input:");
  EXPECT_DEATH(
      decode_data.AddString(1, "def", str_with_null_char),
      "error: got a null char in a string for making TextFormat data, input:");

  // Duplicate keys

  decode_data.AddString(1, "abcdefghIJ", "abcdefghIJ");
  decode_data.AddString(3, "abcdefghIJ", "_AbcdefghIJ");
  decode_data.AddString(2, "abcdefghIJ", "Abcd_EfghIJ");
  EXPECT_DEATH(decode_data.AddString(2, "xyz", "x_yz"),
               "error: duplicate key \\(2\\) making TextFormat data, input:");
}